

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_monitor_data.cc
# Opt level: O0

void anon_unknown.dwarf_2545c::Json2Type
               (Value *value,CdnDescribeCdnMonitorDataCDNMonitorDataType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  CdnDescribeCdnMonitorDataCDNMonitorDataType *local_18;
  CdnDescribeCdnMonitorDataCDNMonitorDataType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (CdnDescribeCdnMonitorDataCDNMonitorDataType *)value;
  bVar1 = Json::Value::isMember(value,"TimeStamp");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"TimeStamp");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"QueryPerSecond");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"QueryPerSecond");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->query_per_second,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"BytesPerSecond");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"BytesPerSecond");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->bytes_per_second,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"BytesHitRate");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"BytesHitRate");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->bytes_hit_rate,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"RequestHitRate");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"RequestHitRate");
    Json::Value::asString_abi_cxx11_(&local_b8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->request_hit_rate,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"AverageObjectSize");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"AverageObjectSize");
    Json::Value::asString_abi_cxx11_(&local_d8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->average_object_size,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, CdnDescribeCdnMonitorDataCDNMonitorDataType* item) {
  if(value.isMember("TimeStamp")) {
    item->time_stamp = value["TimeStamp"].asString();
  }
  if(value.isMember("QueryPerSecond")) {
    item->query_per_second = value["QueryPerSecond"].asString();
  }
  if(value.isMember("BytesPerSecond")) {
    item->bytes_per_second = value["BytesPerSecond"].asString();
  }
  if(value.isMember("BytesHitRate")) {
    item->bytes_hit_rate = value["BytesHitRate"].asString();
  }
  if(value.isMember("RequestHitRate")) {
    item->request_hit_rate = value["RequestHitRate"].asString();
  }
  if(value.isMember("AverageObjectSize")) {
    item->average_object_size = value["AverageObjectSize"].asString();
  }
}